

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O0

coro_result * __thiscall cinatra::radix_tree::get_coro(radix_tree *this,string *path,string *method)

{
  bool bVar1;
  __type_conflict3 _Var2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  element_type *this_00;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int p;
  int n;
  int i;
  shared_ptr<cinatra::radix_tree_node> root;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  key_type *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  byte in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int local_6c;
  __shared_ptr local_68 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x17bdbe);
  std::shared_ptr<cinatra::radix_tree_node>::shared_ptr
            ((shared_ptr<cinatra::radix_tree_node> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe78);
  local_6c = 0;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_18);
LAB_0017bdef:
  do {
    if ((int)sVar3 <= local_6c) {
LAB_0017c1e6:
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17c1fb);
      radix_tree_node::get_coro_handler
                ((radix_tree_node *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
      std::
      tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::
      tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_true,_true>
                ((tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,
                 (function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                  *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffe78);
      std::
      function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
      ::~function((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                   *)0x17c23d);
LAB_0017c26a:
      std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                ((shared_ptr<cinatra::radix_tree_node> *)0x17c277);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)0x17c284);
      return (coro_result *)this_01;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17be10);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17be1f
                      );
    if (bVar1) {
      std::
      tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::tuple<void,_true>((tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)0x17be2f);
      goto LAB_0017c26a;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17be4c);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (size_type)in_stack_fffffffffffffe78);
    if (*pvVar4 == ':') {
      peVar5 = std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x17be7d);
      std::
      vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
      ::operator[](&peVar5->children,0);
      std::shared_ptr<cinatra::radix_tree_node>::operator=
                ((shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe78);
      local_6c = find_pos((radix_tree *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          (char)(in_stack_fffffffffffffe84 >> 0x18),in_stack_fffffffffffffe80);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (size_type)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17befc);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      goto LAB_0017bdef;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17bf91);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (size_type)in_stack_fffffffffffffe78);
    if (*pvVar4 == '*') {
      peVar5 = std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x17bfc2);
      std::
      vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
      ::operator[](&peVar5->children,0);
      std::shared_ptr<cinatra::radix_tree_node>::operator=
                ((shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (size_type)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17c015);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      goto LAB_0017c1e6;
    }
    peVar5 = std::
             __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17c083);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (size_type)in_stack_fffffffffffffe78);
    radix_tree_node::get_child
              ((radix_tree_node *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (char)((ulong)in_stack_fffffffffffffe90 >> 0x38));
    std::shared_ptr<cinatra::radix_tree_node>::operator=
              ((shared_ptr<cinatra::radix_tree_node> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (shared_ptr<cinatra::radix_tree_node> *)in_stack_fffffffffffffe78);
    std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
              ((shared_ptr<cinatra::radix_tree_node> *)0x17c0d6);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_68);
    in_stack_fffffffffffffe9f = 1;
    if (bVar1) {
      in_stack_fffffffffffffe90 = (string *)(long)local_6c;
      in_stack_fffffffffffffe88 = local_18;
      this_00 = std::
                __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x17c121);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&this_00->path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (size_type)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17c15a);
      _Var2 = std::operator==(&peVar5->path,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      in_stack_fffffffffffffe9f = _Var2 ^ 0xff;
    }
    in_stack_fffffffffffffe84 = CONCAT13(in_stack_fffffffffffffe9f,(int3)in_stack_fffffffffffffe84);
    if (bVar1) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    if ((in_stack_fffffffffffffe84 & 0x1000000) != 0) {
      std::
      tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::tuple<void,_true>((tuple<bool,_std::function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)0x17c1a5);
      goto LAB_0017c26a;
    }
    peVar5 = std::
             __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17c1c2);
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&peVar5->path);
    local_6c = local_6c + (int)sVar6;
  } while( true );
}

Assistant:

coro_result get_coro(const std::string &path, const std::string &method) {
    std::unordered_map<std::string, std::string> params;
    auto root = this->root;

    int i = 0, n = path.size(), p;

    while (i < n) {
      if (root->indices.empty())
        return coro_result();

      if (root->indices[0] == type_colon) {
        root = root->children[0];

        p = find_pos(path, type_slash, i);
        params[root->path] = path.substr(i, p - i);
        i = p;
      }
      else if (root->indices[0] == type_asterisk) {
        root = root->children[0];
        params[root->path] = path.substr(i);
        break;
      }
      else {
        root = root->get_child(path[i]);
        if (!root || path.substr(i, root->path.size()) != root->path)
          return coro_result();
        i += root->path.size();
      }
    }

    return coro_result{true, root->get_coro_handler(method), params};
  }